

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O2

void __thiscall DNSResolver::ChangetoDnsNameFormat(DNSResolver *this,uchar *dns,uchar *host)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  char *__dest;
  ulong uVar5;
  undefined8 uStack_30;
  
  uStack_30 = 0x103e8f;
  sVar2 = strlen((char *)host);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  __dest = &stack0xffffffffffffffd8 + lVar1;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x103eab;
  strcpy(__dest,(char *)host);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x103eb3;
  sVar2 = strlen(__dest);
  (__dest + sVar2)[0] = '.';
  (__dest + sVar2)[1] = '\0';
  uVar5 = 0;
  iVar4 = 0;
  while( true ) {
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x103ec8;
    sVar2 = strlen(__dest);
    if (sVar2 <= uVar5) break;
    if (__dest[uVar5] == '.') {
      *dns = (char)uVar5 - (char)iVar4;
      lVar3 = (long)iVar4;
      if (lVar3 < (long)uVar5) {
        iVar4 = (int)uVar5;
      }
      iVar4 = iVar4 + 1;
      for (; dns = dns + 1, lVar3 < (long)uVar5; lVar3 = lVar3 + 1) {
        *dns = __dest[lVar3];
      }
    }
    uVar5 = uVar5 + 1;
  }
  *dns = '\0';
  return;
}

Assistant:

void DNSResolver::ChangetoDnsNameFormat(unsigned char *dns, unsigned char *host) {
    int lock = 0, i;
    char tmp[strlen(reinterpret_cast<const char *>(host)) + 1];
    strcpy(tmp, reinterpret_cast<const char *>(host));
    strcat(tmp, ".");
    for (i = 0; i < strlen(tmp); i++) {
        if (tmp[i] == '.') {
            *dns++ = i - lock;
            for (; lock < i; lock++) {
                *dns++ = tmp[lock];
            }
            lock++; //or lock=i+1;
        }
    }
    *dns++ = '\0';
}